

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian.cpp
# Opt level: O2

void interpolate_step(int row,int col,response_layer *top,response_layer *middle,
                     response_layer *bottom,float *offsets)

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int scale;
  int iVar18;
  int iVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float hessian [9];
  undefined8 local_68;
  float local_60;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  undefined4 local_48;
  float local_44;
  float local_40;
  float local_3c;
  undefined4 local_38;
  
  iVar15 = middle->width;
  iVar2 = top->width;
  iVar19 = row + 1;
  iVar20 = row + -1;
  iVar17 = iVar15 * iVar19;
  iVar16 = iVar2 * row;
  iVar18 = iVar15 / iVar2;
  pfVar3 = middle->response;
  pfVar4 = top->response;
  iVar7 = iVar15 * row;
  iVar15 = iVar15 * iVar20;
  iVar11 = (iVar7 + 1 + col) * iVar18;
  iVar8 = (iVar7 + -1 + col) * iVar18;
  fVar1 = pfVar3[(iVar7 + col) * iVar18];
  iVar12 = (iVar15 + col) * iVar18;
  iVar10 = (iVar17 + col) * iVar18;
  iVar7 = bottom->width;
  iVar13 = row * iVar7;
  auVar22 = SUB6416(ZEXT464(0xc0000000),0);
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(pfVar3[iVar11] + pfVar3[iVar8])),ZEXT416((uint)fVar1),
                            auVar22);
  iVar9 = iVar7 / iVar2;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(pfVar3[iVar10] + pfVar3[iVar12])),ZEXT416((uint)fVar1),
                           auVar22);
  pfVar5 = bottom->response;
  iVar14 = (iVar13 + col) * iVar9;
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(pfVar4[iVar16 + col] + pfVar5[iVar14])),
                            ZEXT416((uint)fVar1),auVar22);
  local_58 = auVar21._0_4_;
  local_54 = (((pfVar3[(iVar17 + 1 + col) * iVar18] - pfVar3[(iVar17 + -1 + col) * iVar18]) -
              pfVar3[(iVar15 + 1 + col) * iVar18]) + pfVar3[(iVar15 + -1 + col) * iVar18]) * 0.25;
  local_50 = (((pfVar4[iVar16 + 1 + col] - pfVar4[iVar16 + -1 + col]) -
              pfVar5[(iVar13 + 1 + col) * iVar9]) + pfVar5[(iVar13 + -1 + col) * iVar9]) * 0.25;
  local_48 = auVar6._0_4_;
  local_44 = (((pfVar4[iVar2 * iVar19 + col] - pfVar4[iVar2 * iVar20 + col]) -
              pfVar5[(iVar19 * iVar7 + col) * iVar9]) + pfVar5[(iVar7 * iVar20 + col) * iVar9]) *
             0.25;
  local_38 = auVar22._0_4_;
  local_60 = (pfVar4[iVar16 + col] - pfVar5[iVar14]) * -0.5;
  auVar21 = vinsertps_avx(ZEXT416((uint)pfVar3[iVar11]),ZEXT416((uint)pfVar3[iVar10]),0x10);
  auVar6 = vinsertps_avx(ZEXT416((uint)pfVar3[iVar8]),ZEXT416((uint)pfVar3[iVar12]),0x10);
  auVar21 = vsubps_avx(auVar21,auVar6);
  auVar6._8_4_ = 0xbf000000;
  auVar6._0_8_ = 0xbf000000bf000000;
  auVar6._12_4_ = 0xbf000000;
  auVar21 = vmulps_avx512vl(auVar21,auVar6);
  local_68 = vmovlps_avx(auVar21);
  local_4c = local_54;
  local_40 = local_50;
  local_3c = local_44;
  solve_linear_3x3_system(&local_58,(float *)&local_68,offsets);
  return;
}

Assistant:

void interpolate_step(int row, int col,
                      struct response_layer *top, struct response_layer *middle, struct response_layer *bottom,
                      float offsets[3]) {

    assert(top != NULL && middle != NULL && bottom != NULL);
    assert(offsets != NULL);

    float hessian[9];
    {
        float v = get_response_relative(middle, row, col, top);

        // computing second order partial derivatives in xy position, as well as scale direction
        float dxx = get_response_relative(middle, row, col + 1, top) + get_response_relative(middle, row, col - 1, top) - 2.0f * v;
        float dyy = get_response_relative(middle, row + 1, col, top) + get_response_relative(middle, row - 1, col, top) - 2.0f * v;
        float dss = get_response(top, row, col) + get_response_relative(bottom, row, col, top) - 2.0f * v;

        float dxy = (get_response_relative(middle, row + 1, col + 1, top) - get_response_relative(middle, row + 1, col - 1, top) -
                     get_response_relative(middle, row - 1, col + 1, top) + get_response_relative(middle, row - 1, col - 1, top)) / 4.0f;
        float dxs = (get_response(top, row, col + 1) - get_response(top, row, col - 1) -
                     get_response_relative(bottom, row, col + 1, top) + get_response_relative(bottom, row, col - 1, top)) / 4.0f;
        float dys = (get_response(top, row + 1, col) - get_response(top, row - 1, col) -
                     get_response_relative(bottom, row + 1, col, top) + get_response_relative(bottom, row - 1, col, top)) / 4.0f;

        // constructing hessian 3x3 matrix:
        // dxx dxy dxs
        // dxy dyy dys
        // dxs dys dss
        hessian[0] = dxx;
        hessian[1] = dxy;
        hessian[2] = dxs;
        hessian[3] = dxy;
        hessian[4] = dyy;
        hessian[5] = dys;
        hessian[6] = dxs;
        hessian[7] = dys;
        hessian[8] = dss;
    }

    float neg_gradient[3];
    {
        float dx = (get_response_relative(middle, row, col + 1, top) - get_response_relative(middle, row, col - 1, top)) / 2.0f;
        float dy = (get_response_relative(middle, row + 1, col, top) - get_response_relative(middle, row - 1, col, top)) / 2.0f;
        float ds = (get_response(top, row, col) - get_response_relative(bottom, row, col, top)) / 2.0f;

        // constructing negative gradient 3x1 vector
        neg_gradient[0] = -dx;
        neg_gradient[1] = -dy;
        neg_gradient[2] = -ds;
    }

    // solving linear system hessian * offsets = neg_gradient to get sub-pixel offsets
    solve_linear_3x3_system(hessian, neg_gradient, offsets);

}